

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O3

void __thiscall wasm::PassRunner::PassRunner(PassRunner *this,Module *wasm,PassOptions *options)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  size_t sVar5;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
  local_28;
  __alloc_node_gen_t __alloc_node_gen;
  
  *(code **)this = ::wasm::Binary::finalize;
  *(Module **)(this + 8) = wasm;
  *(MixedArena **)(this + 0x10) = &wasm->allocator;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  uVar2 = *(undefined8 *)&options->shrinkLevel;
  uVar3 = *(undefined8 *)&(options->inlining).oneCallerInlineMaxSize;
  uVar4 = *(undefined8 *)&(options->inlining).allowFunctionsWithLoops;
  *(undefined8 *)(this + 0x30) = *(undefined8 *)options;
  *(undefined8 *)(this + 0x38) = uVar2;
  *(undefined8 *)(this + 0x40) = uVar3;
  *(undefined8 *)(this + 0x48) = uVar4;
  *(undefined8 *)(this + 0x50) = *(undefined8 *)&options->ignoreImplicitTraps;
  local_28._M_h = (__hashtable_alloc *)(this + 0x58);
  *(undefined8 *)(this + 0x58) = 0;
  *(size_type *)(this + 0x60) = (options->arguments)._M_h._M_bucket_count;
  *(undefined8 *)(this + 0x68) = 0;
  *(size_type *)(this + 0x70) = (options->arguments)._M_h._M_element_count;
  sVar5 = (options->arguments)._M_h._M_rehash_policy._M_next_resize;
  *(undefined8 *)(this + 0x78) = *(undefined8 *)&(options->arguments)._M_h._M_rehash_policy;
  *(size_t *)(this + 0x80) = sVar5;
  *(undefined8 *)(this + 0x88) = 0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_28._M_h,&(options->arguments)._M_h,&local_28);
  local_28._M_h = (__hashtable_alloc *)(this + 0x90);
  *(undefined8 *)(this + 0x90) = 0;
  *(size_type *)(this + 0x98) = (options->passesToSkip)._M_h._M_bucket_count;
  *(undefined8 *)(this + 0xa0) = 0;
  *(size_type *)(this + 0xa8) = (options->passesToSkip)._M_h._M_element_count;
  sVar5 = (options->passesToSkip)._M_h._M_rehash_policy._M_next_resize;
  *(undefined8 *)(this + 0xb0) = *(undefined8 *)&(options->passesToSkip)._M_h._M_rehash_policy;
  *(size_t *)(this + 0xb8) = sVar5;
  *(undefined8 *)(this + 0xc0) = 0;
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_28._M_h,&(options->passesToSkip)._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
              *)&local_28);
  *(element_type **)(this + 200) =
       (options->funcEffectsMap).
       super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  p_Var1 = (options->funcEffectsMap).
           super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0xd0) = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(p_Var1 + 8) = *(int *)(p_Var1 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(p_Var1 + 8) = *(int *)(p_Var1 + 8) + 1;
    }
  }
  *(undefined2 *)(this + 0xd8) = 0;
  this[0xda] = (PassRunner)0x0;
  *(PassRunner **)(this + 0xe0) = this + 0x110;
  *(undefined8 *)(this + 0xe8) = 1;
  *(undefined8 *)(this + 0xf0) = 0;
  *(undefined8 *)(this + 0xf8) = 0;
  *(undefined4 *)(this + 0x100) = 0x3f800000;
  *(undefined8 *)(this + 0x108) = 0;
  *(undefined8 *)(this + 0x110) = 0;
  return;
}

Assistant:

PassRunner(Module* wasm, PassOptions options)
    : wasm(wasm), allocator(&wasm->allocator), options(options) {}